

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O3

QHostInfo __thiscall QHostInfoAgent::reverseLookup(QHostInfoAgent *this,QHostAddress *address)

{
  QArrayData *pQVar1;
  long lVar2;
  NetworkLayerProtocol NVar3;
  quint32 qVar4;
  int iVar5;
  undefined1 *puVar6;
  socklen_t __salen;
  undefined1 *puVar7;
  sockaddr *__sa;
  long in_FS_OFFSET;
  QByteArrayView QVar8;
  Q_IPV6ADDR QVar9;
  char hbuf [1025];
  QArrayDataPointer<QHostAddress> local_498;
  char local_478 [1025];
  undefined1 local_77 [15];
  undefined1 *local_68;
  char acStack_60 [8];
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined8 local_48;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)this = &DAT_aaaaaaaaaaaaaaaa;
  QHostInfo::QHostInfo((QHostInfo *)this,-1);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  uStack_58 = 0xaaaaaaaa;
  uStack_54 = 0xaaaaaaaa;
  uStack_50 = 0xaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  acStack_60[0] = -0x56;
  acStack_60[1] = -0x56;
  acStack_60[2] = -0x56;
  acStack_60[3] = -0x56;
  acStack_60[4] = -0x56;
  acStack_60[5] = -0x56;
  acStack_60[6] = -0x56;
  acStack_60[7] = -0x56;
  NVar3 = QHostAddress::protocol(address);
  if (NVar3 == IPv4Protocol) {
    __sa = (sockaddr *)&local_48;
    puStack_40 = (undefined1 *)0x0;
    local_48._0_2_ = 2;
    local_48._2_1_ = '\0';
    local_48._3_1_ = '\0';
    local_48._4_1_ = '\0';
    local_48._5_1_ = '\0';
    local_48._6_1_ = '\0';
    local_48._7_1_ = '\0';
    qVar4 = QHostAddress::toIPv4Address(address,(bool *)0x0);
    local_48 = (undefined1 *)
               CONCAT44(qVar4 >> 0x18 | (qVar4 & 0xff0000) >> 8 | (qVar4 & 0xff00) << 8 |
                        qVar4 << 0x18,(undefined4)local_48);
    __salen = 0x10;
  }
  else {
    __sa = (sockaddr *)&local_68;
    acStack_60[0] = '\0';
    acStack_60[1] = '\0';
    acStack_60[2] = '\0';
    acStack_60[3] = '\0';
    acStack_60[4] = '\0';
    acStack_60[5] = '\0';
    acStack_60[6] = '\0';
    acStack_60[7] = '\0';
    uStack_58 = 0;
    uStack_54 = 0;
    uStack_50 = 0;
    local_68 = (undefined1 *)0xa;
    QVar9 = QHostAddress::toIPv6Address(address);
    acStack_60._0_4_ = QVar9.c._0_4_;
    acStack_60._4_4_ = QVar9.c._4_4_;
    uStack_58 = QVar9.c._8_4_;
    uStack_54 = QVar9.c._12_4_;
    __salen = 0x1c;
  }
  memset(local_478,0xaa,0x401);
  iVar5 = getnameinfo(__sa,__salen,local_478,0x401,(char *)0x0,0,0);
  if (iVar5 == 0) {
    puVar6 = (undefined1 *)memchr(local_478,0,0x401);
    puVar7 = local_77;
    if (puVar6 != (undefined1 *)0x0) {
      puVar7 = puVar6;
    }
    QVar8.m_data = puVar7 + -(long)local_478;
    QVar8.m_size = (qsizetype)&local_498;
    QString::fromLatin1(QVar8);
    QString::operator=((QString *)(*(long *)this + 0x38),(QString *)&local_498);
    if (&(local_498.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_498.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_498.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_498.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_498.d)->super_QArrayData,2,0x10);
      }
    }
  }
  pQVar1 = *(QArrayData **)(*(long *)this + 0x38);
  lVar2 = *(long *)(*(long *)this + 0x48);
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,0x10);
    }
  }
  if (lVar2 == 0) {
    QHostAddress::toString((QString *)&local_498,address);
    QString::operator=((QString *)(*(long *)this + 0x38),(QString *)&local_498);
    if (&(local_498.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_498.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_498.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_498.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_498.d)->super_QArrayData,2,0x10);
      }
    }
  }
  local_498.d = (Data *)0x0;
  local_498.ptr = (QHostAddress *)0x0;
  local_498.size = 0;
  QtPrivate::QMovableArrayOps<QHostAddress>::emplace<QHostAddress_const&>
            ((QMovableArrayOps<QHostAddress> *)&local_498,0,address);
  QList<QHostAddress>::end((QList<QHostAddress> *)&local_498);
  QArrayDataPointer<QHostAddress>::operator=
            ((QArrayDataPointer<QHostAddress> *)(*(long *)this + 0x20),&local_498);
  QArrayDataPointer<QHostAddress>::~QArrayDataPointer(&local_498);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QHostInfo)(QHostInfoPrivate *)this;
  }
  __stack_chk_fail();
}

Assistant:

QHostInfo QHostInfoAgent::reverseLookup(const QHostAddress &address)
{
    QHostInfo results;
    // Reverse lookup
    sockaddr_in sa4;
    sockaddr_in6 sa6;
    sockaddr *sa = nullptr;
    QT_SOCKLEN_T saSize;
    if (address.protocol() == QAbstractSocket::IPv4Protocol) {
        sa = reinterpret_cast<sockaddr *>(&sa4);
        saSize = sizeof(sa4);
        memset(&sa4, 0, sizeof(sa4));
        sa4.sin_family = AF_INET;
        sa4.sin_addr.s_addr = htonl(address.toIPv4Address());
    } else {
        sa = reinterpret_cast<sockaddr *>(&sa6);
        saSize = sizeof(sa6);
        memset(&sa6, 0, sizeof(sa6));
        sa6.sin6_family = AF_INET6;
        memcpy(&sa6.sin6_addr, address.toIPv6Address().c, sizeof(sa6.sin6_addr));
    }

    char hbuf[NI_MAXHOST];
    if (sa && getnameinfo(sa, saSize, hbuf, sizeof(hbuf), nullptr, 0, 0) == 0)
        results.setHostName(QString::fromLatin1(hbuf));

    if (results.hostName().isEmpty())
        results.setHostName(address.toString());
    results.setAddresses(QList<QHostAddress>() << address);

    return results;
}